

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi64 HashmapCount(jx9_hashmap *pMap,int bRecursive,int iRecCount)

{
  uint uVar1;
  uint uVar2;
  jx9_vm *pjVar3;
  jx9_hashmap_node *pjVar4;
  void *pvVar5;
  ulong uVar6;
  sxi64 sVar7;
  uint uVar8;
  jx9_hashmap_node **ppjVar9;
  long lVar10;
  ulong uVar11;
  
  uVar8 = pMap->nEntry;
  uVar11 = (ulong)uVar8;
  if (bRecursive != 0) {
    if (uVar8 == 0) {
      lVar10 = 0;
    }
    else {
      pjVar3 = pMap->pVm;
      ppjVar9 = &pMap->pLast;
      uVar1 = (pjVar3->aMemObj).nUsed;
      lVar10 = 0;
      do {
        pjVar4 = *ppjVar9;
        uVar2 = pjVar4->nValIdx;
        if (((uVar2 < uVar1) && (pvVar5 = (pjVar3->aMemObj).pBase, pvVar5 != (void *)0x0)) &&
           (uVar6 = (ulong)(uVar2 * (pjVar3->aMemObj).eSize),
           (*(byte *)((long)pvVar5 + uVar6 + 8) & 0x40) != 0)) {
          if (0x1f < iRecCount) {
            return lVar10;
          }
          sVar7 = HashmapCount(*(jx9_hashmap **)((long)pvVar5 + uVar6),1,iRecCount + 1);
          lVar10 = lVar10 + sVar7;
        }
        ppjVar9 = &pjVar4->pNext;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    uVar11 = lVar10 + uVar11;
  }
  return uVar11;
}

Assistant:

static sxi64 HashmapCount(jx9_hashmap *pMap, int bRecursive, int iRecCount)
{
	sxi64 iCount = 0;
	if( !bRecursive ){
		iCount = pMap->nEntry;
	}else{
		/* Recursive hashmap walk */
		jx9_hashmap_node *pEntry = pMap->pLast;
		jx9_value *pElem;
		sxu32 n = 0;
		for(;;){
			if( n >= pMap->nEntry ){
				break;
			}
			/* Point to the element value */
			pElem = (jx9_value *)SySetAt(&pMap->pVm->aMemObj, pEntry->nValIdx);
			if( pElem ){
				if( pElem->iFlags & MEMOBJ_HASHMAP ){
					if( iRecCount > 31 ){
						/* Nesting limit reached */
						return iCount;
					}
					/* Recurse */
					iRecCount++;
					iCount += HashmapCount((jx9_hashmap *)pElem->x.pOther, TRUE, iRecCount);
					iRecCount--;
				}
			}
			/* Point to the next entry */
			pEntry = pEntry->pNext;
			++n;
		}
		/* Update count */
		iCount += pMap->nEntry;
	}
	return iCount;
}